

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

ssize_t Curl_bufq_write_pass
                  (bufq *q,uchar *buf,size_t len,Curl_bufq_writer *writer,void *writer_ctx,
                  CURLcode *err)

{
  _Bool _Var1;
  ssize_t sVar2;
  ssize_t n;
  ssize_t nwritten;
  CURLcode *err_local;
  void *writer_ctx_local;
  Curl_bufq_writer *writer_local;
  size_t len_local;
  uchar *buf_local;
  bufq *q_local;
  
  n = 0;
  *err = CURLE_OK;
  writer_local = (Curl_bufq_writer *)len;
  len_local = (size_t)buf;
  do {
    if (writer_local == (Curl_bufq_writer *)0x0) {
LAB_001157a0:
      if ((n == 0) && (writer_local != (Curl_bufq_writer *)0x0)) {
        *err = CURLE_AGAIN;
        q_local = (bufq *)0xffffffffffffffff;
      }
      else {
        *err = CURLE_OK;
        q_local = (bufq *)n;
      }
      return (ssize_t)q_local;
    }
    _Var1 = Curl_bufq_is_full(q);
    if ((_Var1) && (sVar2 = Curl_bufq_pass(q,writer,writer_ctx,err), sVar2 < 0)) {
      if (*err != CURLE_AGAIN) {
        return -1;
      }
      goto LAB_001157a0;
    }
    sVar2 = Curl_bufq_write(q,(uchar *)len_local,(size_t)writer_local,err);
    if (sVar2 < 0) {
      if (*err != CURLE_AGAIN) {
        return -1;
      }
      goto LAB_001157a0;
    }
    if (sVar2 == 0) goto LAB_001157a0;
    len_local = sVar2 + len_local;
    writer_local = writer_local + -sVar2;
    n = sVar2 + n;
  } while( true );
}

Assistant:

ssize_t Curl_bufq_write_pass(struct bufq *q,
                             const unsigned char *buf, size_t len,
                             Curl_bufq_writer *writer, void *writer_ctx,
                             CURLcode *err)
{
  ssize_t nwritten = 0, n;

  *err = CURLE_OK;
  while(len) {
    if(Curl_bufq_is_full(q)) {
      /* try to make room in case we are full */
      n = Curl_bufq_pass(q, writer, writer_ctx, err);
      if(n < 0) {
        if(*err != CURLE_AGAIN) {
          /* real error, fail */
          return -1;
        }
        /* would block, bufq is full, give up */
        break;
      }
    }

    /* Add whatever is remaining now to bufq */
    n = Curl_bufq_write(q, buf, len, err);
    if(n < 0) {
      if(*err != CURLE_AGAIN) {
        /* real error, fail */
        return -1;
      }
      /* no room in bufq */
      break;
    }
    /* edge case of writer returning 0 (and len is >0)
     * break or we might enter an infinite loop here */
    if(n == 0)
      break;

    /* Maybe only part of `data` has been added, continue to loop */
    buf += (size_t)n;
    len -= (size_t)n;
    nwritten += (size_t)n;
  }

  if(!nwritten && len) {
    *err = CURLE_AGAIN;
    return -1;
  }
  *err = CURLE_OK;
  return nwritten;
}